

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfm.cpp
# Opt level: O2

void embree::skipSpacesAndComments(fstream *file)

{
  int iVar1;
  string line;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  while( true ) {
    while( true ) {
      iVar1 = std::istream::peek();
      iVar1 = isspace(iVar1);
      if (iVar1 == 0) break;
      std::istream::ignore();
    }
    iVar1 = std::istream::peek();
    if (iVar1 != 0x23) break;
    local_30 = 0;
    local_28[0] = 0;
    local_38 = local_28;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)file,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

static void skipSpacesAndComments(std::fstream& file)
  {
    while (true)
    {
      if  (isspace(file.peek())) {
        file.ignore();
      } else  if (file.peek() == '#') {
        std::string line; std::getline(file,line);
      } else break;
    }
  }